

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-accept.c
# Opt level: O0

int run_test_tcp_close_accept(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_tcp_t *client;
  uv_loop_t *loop;
  uint i;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-close-accept.c"
            ,0xa5,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  iVar1 = uv_tcp_init(puVar2,&tcp_server);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-close-accept.c"
            ,0xa7,"0 == uv_tcp_init(loop, &tcp_server)");
    abort();
  }
  iVar1 = uv_tcp_bind(&tcp_server,(sockaddr *)&addr,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-close-accept.c"
            ,0xa8,"0 == uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0)");
    abort();
  }
  iVar1 = uv_listen((uv_stream_t *)&tcp_server,2,connection_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-close-accept.c"
            ,0xab,
            "0 == uv_listen((uv_stream_t*) &tcp_server, ARRAY_SIZE(tcp_outgoing), connection_cb)");
    abort();
  }
  for (loop._4_4_ = 0; loop._4_4_ < 2; loop._4_4_ = loop._4_4_ + 1) {
    iVar1 = uv_tcp_init(puVar2,tcp_outgoing + loop._4_4_);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-close-accept.c"
              ,0xb0,"0 == uv_tcp_init(loop, client)");
      abort();
    }
    iVar1 = uv_tcp_connect(connect_reqs + loop._4_4_,tcp_outgoing + loop._4_4_,(sockaddr *)&addr,
                           connect_cb);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-close-accept.c"
              ,0xb4,
              "0 == uv_tcp_connect(&connect_reqs[i], client, (const struct sockaddr*) &addr, connect_cb)"
             );
      abort();
    }
  }
  uv_run(puVar2,UV_RUN_DEFAULT);
  if (got_connections != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-close-accept.c"
            ,0xb9,"ARRAY_SIZE(tcp_outgoing) == got_connections");
    abort();
  }
  if (close_cb_called != 4) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-close-accept.c"
            ,0xba,"(ARRAY_SIZE(tcp_outgoing) + 2) == close_cb_called");
    abort();
  }
  if (write_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-close-accept.c"
            ,0xbb,"ARRAY_SIZE(tcp_outgoing) == write_cb_called");
    abort();
  }
  if (read_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-close-accept.c"
            ,0xbc,"1 == read_cb_called");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-close-accept.c"
            ,0xbe,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(tcp_close_accept) {
  unsigned int i;
  uv_loop_t* loop;
  uv_tcp_t* client;

  /*
   * A little explanation of what goes on below:
   *
   * We'll create server and connect to it using two clients, each writing one
   * byte once connected.
   *
   * When all clients will be accepted by server - we'll start reading from them
   * and, on first client's first byte, will close second client and server.
   * After that, we'll immediately initiate new connection to server using
   * tcp_check handle (thus, reusing fd from second client).
   *
   * In this situation uv__io_poll()'s event list should still contain read
   * event for second client, and, if not cleaned up properly, `tcp_check` will
   * receive stale event of second incoming and invoke `connect_cb` with zero
   * status.
   */

  loop = uv_default_loop();
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT(0 == uv_tcp_init(loop, &tcp_server));
  ASSERT(0 == uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &tcp_server,
                        ARRAY_SIZE(tcp_outgoing),
                        connection_cb));

  for (i = 0; i < ARRAY_SIZE(tcp_outgoing); i++) {
    client = tcp_outgoing + i;

    ASSERT(0 == uv_tcp_init(loop, client));
    ASSERT(0 == uv_tcp_connect(&connect_reqs[i],
                               client,
                               (const struct sockaddr*) &addr,
                               connect_cb));
  }

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(ARRAY_SIZE(tcp_outgoing) == got_connections);
  ASSERT((ARRAY_SIZE(tcp_outgoing) + 2) == close_cb_called);
  ASSERT(ARRAY_SIZE(tcp_outgoing) == write_cb_called);
  ASSERT(1 == read_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}